

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

int Ssw_SmlObjsAreEqualWord(Ssw_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = p->nWordsTotal;
  lVar4 = (long)p->nWordsPref;
  do {
    if (iVar3 <= lVar4) {
      return 1;
    }
    lVar1 = lVar4 * 4;
    lVar2 = lVar4 * 4;
    lVar4 = lVar4 + 1;
  } while (*(int *)((long)&p[1].pAig + lVar1 + (long)(pObj0->Id * iVar3) * 4) ==
           *(int *)((long)&p[1].pAig + lVar2 + (long)(pObj1->Id * iVar3) * 4));
  return 0;
}

Assistant:

int Ssw_SmlObjsAreEqualWord( Ssw_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    pSims0 = Ssw_ObjSim(p, pObj0->Id);
    pSims1 = Ssw_ObjSim(p, pObj1->Id);
    for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}